

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool HasDefaultConstructor(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  Allocator *pAVar1;
  FunctionData *pFVar2;
  TypeBase *pTVar3;
  ArrayView<ArgumentData> arguments_00;
  bool bVar4;
  int iVar5;
  FunctionData **ppFVar6;
  undefined4 extraout_var;
  uint i;
  uint index;
  ArrayView<FunctionValue> functions_00;
  undefined4 uStack_b3c;
  FunctionValue bestOverload;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<FunctionValue,_32U> overloads;
  SmallArray<ArgumentData,_32U> arguments;
  
  for (; (type != (TypeBase *)0x0 && (type->typeID == 0x13));
      type = (TypeBase *)type[1]._vptr_TypeBase) {
  }
  functions.allocator = ctx->allocator;
  functions.data = functions.little;
  functions.count = 0;
  functions.max = 0x20;
  bVar4 = GetTypeConstructorFunctions(ctx,type,true,&functions);
  index = 0;
  if (bVar4) {
    pAVar1 = ctx->allocator;
    memset(overloads.little,0,0x300);
    overloads.count = 0;
    overloads.max = 0x20;
    overloads.data = overloads.little;
    overloads.allocator = pAVar1;
    for (; index < functions.count; index = index + 1) {
      ppFVar6 = SmallArray<FunctionData_*,_32U>::operator[](&functions,index);
      pFVar2 = *ppFVar6;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      arguments.little[0].source = (SynBase *)CONCAT44(extraout_var,iVar5);
      pTVar3 = pFVar2->contextType;
      (arguments.little[0].source)->typeID = 9;
      (arguments.little[0].source)->begin = (Lexeme *)source;
      (arguments.little[0].source)->end = (Lexeme *)pTVar3;
      ((arguments.little[0].source)->pos).begin = (char *)0x0;
      *(undefined1 *)&((arguments.little[0].source)->pos).end = 0;
      (arguments.little[0].source)->_vptr_SynBase = (_func_int **)&PTR__ExprBase_003e35c8;
      arguments.data = (ArgumentData *)source;
      arguments._8_8_ = pFVar2;
      SmallArray<FunctionValue,_32U>::push_back(&overloads,(FunctionValue *)&arguments);
    }
    ratings.allocator = ctx->allocator;
    ratings.data = ratings.little;
    ratings.count = 0;
    ratings.max = 0x20;
    SmallArray<ArgumentData,_32U>::SmallArray(&arguments,ratings.allocator);
    functions_00.count = overloads.count;
    functions_00.data = overloads.data;
    arguments_00._12_4_ = uStack_b3c;
    arguments_00.count = arguments.count;
    arguments_00.data = arguments.data;
    functions_00._12_4_ = 0;
    SelectBestFunction(&bestOverload,ctx,source,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                       arguments_00,&ratings);
    index = (uint)(bestOverload.function != (FunctionData *)0x0);
    SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
    SmallArray<unsigned_int,_32U>::~SmallArray(&ratings);
    SmallArray<FunctionValue,_32U>::~SmallArray(&overloads);
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray(&functions);
  return SUB41(index,0);
}

Assistant:

bool HasDefaultConstructor(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	// Find array element type
	while(TypeArray *arrType = getType<TypeArray>(type))
		type = arrType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, true, functions))
	{
		SmallArray<FunctionValue, 32> overloads(ctx.allocator);

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			overloads.push_back(FunctionValue(source, curr, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, curr->contextType)));
		}

		SmallArray<unsigned, 32> ratings(ctx.allocator);
		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		if(FunctionValue bestOverload = SelectBestFunction(ctx, source, overloads, IntrusiveList<TypeHandle>(), arguments, ratings))
			return true;

		return false;
	}

	return false;
}